

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::updateLongRangePotentials(SPFForceManager *this)

{
  Vector<double,_7U> *in_RDI;
  double dVar1;
  RealType surfacePotential;
  RealType reciprocalPotential;
  potVec longRangePotentials;
  Snapshot *in_stack_fffffffffffffee8;
  potVec *lrPot;
  Snapshot *in_stack_fffffffffffffef0;
  Vector<double,_7U> *in_stack_fffffffffffffef8;
  double in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  SPFForceManager *in_stack_ffffffffffffff30;
  Vector<double,_7U> *in_stack_ffffffffffffffb8;
  Vector<double,_7U> *in_stack_ffffffffffffffc0;
  SPFForceManager *in_stack_ffffffffffffffc8;
  
  Snapshot::getLongRangePotentials(in_stack_fffffffffffffee8);
  Snapshot::getLongRangePotentials(in_stack_fffffffffffffee8);
  linearCombination<OpenMD::Vector<double,7u>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  lrPot = (potVec *)in_RDI[0x39].data_[3];
  Vector<double,_7U>::Vector(in_RDI,in_stack_fffffffffffffef8);
  Snapshot::setLongRangePotentials(in_stack_fffffffffffffef0,lrPot);
  Snapshot::getReciprocalPotential((Snapshot *)in_RDI[0x39].data_[4]);
  Snapshot::getReciprocalPotential((Snapshot *)in_RDI[0x39].data_[5]);
  dVar1 = linearCombination<double>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  Snapshot::setReciprocalPotential((Snapshot *)in_RDI[0x39].data_[3],dVar1);
  Snapshot::getSurfacePotential((Snapshot *)in_RDI[0x39].data_[4]);
  Snapshot::getSurfacePotential((Snapshot *)in_RDI[0x39].data_[5]);
  dVar1 = linearCombination<double>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  Snapshot::setSurfacePotential((Snapshot *)in_RDI[0x39].data_[3],dVar1);
  return;
}

Assistant:

void SPFForceManager::updateLongRangePotentials() {
    potVec longRangePotentials =
        linearCombination(temporarySourceSnapshot_->getLongRangePotentials(),
                          temporarySinkSnapshot_->getLongRangePotentials());
    currentSnapshot_->setLongRangePotentials(longRangePotentials);

    RealType reciprocalPotential =
        linearCombination(temporarySourceSnapshot_->getReciprocalPotential(),
                          temporarySinkSnapshot_->getReciprocalPotential());
    currentSnapshot_->setReciprocalPotential(reciprocalPotential);

    RealType surfacePotential =
        linearCombination(temporarySourceSnapshot_->getSurfacePotential(),
                          temporarySinkSnapshot_->getSurfacePotential());
    currentSnapshot_->setSurfacePotential(surfacePotential);
  }